

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O1

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::OnReturnCallExpr
          (BinaryReaderInterp *this,Index func_index)

{
  pointer pFVar1;
  long lVar2;
  pointer pTVar3;
  pointer pTVar4;
  pointer pTVar5;
  Istream *this_00;
  pointer pFVar6;
  Index IVar7;
  Result RVar8;
  Offset offset;
  uint uVar9;
  int iVar10;
  uint keep;
  Enum EVar11;
  u32 *puVar12;
  Location local_98;
  Var local_78;
  
  pFVar1 = (this->func_types_).
           super__Vector_base<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar2 = *(long *)&pFVar1[func_index].params.
                    super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl;
  pTVar3 = *(pointer *)
            ((long)&pFVar1[func_index].params.
                    super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl + 8);
  pTVar4 = (this->validator_).typechecker_.type_stack_.
           super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
           super__Vector_impl_data._M_start;
  pTVar5 = (this->validator_).typechecker_.type_stack_.
           super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
           super__Vector_impl_data._M_finish;
  IVar7 = SharedValidator::GetLocalCount(&this->validator_);
  local_98.field_1.field_0.line = 0;
  local_98.field_1._4_8_ = 0;
  local_98.filename.data_ = (char *)0x0;
  local_98.filename.size_._0_4_ = 0;
  local_98.filename.size_._4_4_ = 0;
  Var::Var(&local_78,func_index,&local_98);
  RVar8 = SharedValidator::OnReturnCall
                    (&this->validator_,(Location *)(anonymous_namespace)::BinaryReaderInterp::loc,
                     &local_78);
  Var::~Var(&local_78);
  EVar11 = Error;
  if (RVar8.enum_ != Error) {
    EVar11 = Ok;
    uVar9 = (uint)((ulong)((long)pTVar5 - (long)pTVar4) >> 2);
    keep = (uint)((ulong)((long)pTVar3 - lVar2) >> 2);
    iVar10 = uVar9 - keep;
    if (uVar9 < keep) {
      iVar10 = 0;
    }
    Istream::EmitDropKeep(this->istream_,iVar10 + IVar7,keep);
    this_00 = this->istream_;
    pFVar6 = (this->module_->funcs).
             super__Vector_base<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar9 = (int)((ulong)((long)(this->func_types_).
                                super__Vector_base<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->func_types_).
                               super__Vector_base<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 6) +
            (int)((ulong)((long)(this->module_->funcs).
                                super__Vector_base<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar6) >> 5) *
            0x55555555;
    if (func_index < uVar9) {
      Istream::Emit(this_00,InterpCallImport,func_index);
      Istream::Emit(this->istream_,Return);
    }
    else {
      puVar12 = &pFVar6[func_index - uVar9].code_offset;
      if (*puVar12 == 0xffffffff) {
        offset = Istream::end(this_00);
        FixupMap::Append(&this->func_fixups_,func_index,offset);
      }
      Istream::Emit(this_00,Br,*puVar12);
      EVar11 = Ok;
    }
  }
  return (Result)EVar11;
}

Assistant:

Result BinaryReaderInterp::OnReturnCallExpr(Index func_index) {
  FuncType& func_type = func_types_[func_index];

  Index drop_count, keep_count;
  CHECK_RESULT(
      GetReturnCallDropKeepCount(func_type, 0, &drop_count, &keep_count));
  // The validator must be run after we get the drop/keep counts, since it
  // will change the type stack.
  CHECK_RESULT(validator_.OnReturnCall(loc, Var(func_index)));
  istream_.EmitDropKeep(drop_count, keep_count);

  if (func_index >= num_func_imports()) {
    istream_.Emit(Opcode::Br, GetFuncOffset(func_index));
  } else {
    istream_.Emit(Opcode::InterpCallImport, func_index);
    istream_.Emit(Opcode::Return);
  }

  return Result::Ok;
}